

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

void __thiscall
jsonnet::internal::FodderElement::FodderElement
          (FodderElement *this,Kind kind,uint blanks,uint indent,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *comment)

{
  size_type sVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000028;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000030;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  in_RDI[2] = in_ECX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_00000030,in_stack_00000028);
  bVar2 = true;
  if (in_ESI == 0) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_R8);
    bVar2 = sVar1 < 2;
  }
  if (!bVar2) {
    __assert_fail("kind != LINE_END || comment.size() <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/lexer.h",
                  0x5e,
                  "jsonnet::internal::FodderElement::FodderElement(Kind, unsigned int, unsigned int, const std::vector<std::string> &)"
                 );
  }
  bVar2 = true;
  if (((in_ESI == 1) && (bVar2 = false, in_EDX == 0)) && (bVar2 = false, in_ECX == 0)) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_R8);
    bVar2 = sVar1 == 1;
  }
  if (!bVar2) {
    __assert_fail("kind != INTERSTITIAL || (blanks == 0 && indent == 0 && comment.size() == 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/lexer.h",
                  0x5f,
                  "jsonnet::internal::FodderElement::FodderElement(Kind, unsigned int, unsigned int, const std::vector<std::string> &)"
                 );
  }
  bVar2 = true;
  if (in_ESI == 2) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_R8);
    bVar2 = sVar1 != 0;
  }
  if (bVar2) {
    return;
  }
  __assert_fail("kind != PARAGRAPH || comment.size() >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/lexer.h",
                0x60,
                "jsonnet::internal::FodderElement::FodderElement(Kind, unsigned int, unsigned int, const std::vector<std::string> &)"
               );
}

Assistant:

FodderElement(Kind kind, unsigned blanks, unsigned indent,
                  const std::vector<std::string> &comment)
        : kind(kind), blanks(blanks), indent(indent), comment(comment)
    {
        assert(kind != LINE_END || comment.size() <= 1);
        assert(kind != INTERSTITIAL || (blanks == 0 && indent == 0 && comment.size() == 1));
        assert(kind != PARAGRAPH || comment.size() >= 1);
    }